

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::Read
          (PosixMmapReadableFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  Slice local_58;
  Slice local_48;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  uint64_t offset_local;
  PosixMmapReadableFile *this_local;
  
  scratch_local = scratch;
  result_local = result;
  n_local = n;
  offset_local = offset;
  this_local = this;
  if (*(ulong *)(offset + 0x10) < (long)&result->data_ + n) {
    Slice::Slice(&local_48);
    *(char **)scratch_local = local_48.data_;
    *(size_t *)(scratch_local + 8) = local_48.size_;
    PosixError((anon_unknown_1 *)this,(string *)(offset + 0x20),0x16);
  }
  else {
    Slice::Slice(&local_58,(char *)(*(long *)(offset + 8) + n),(size_t)result);
    *(char **)scratch_local = local_58.data_;
    *(size_t *)(scratch_local + 8) = local_58.size_;
    Status::OK();
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    if (offset + n > length_) {
      *result = Slice();
      return PosixError(filename_, EINVAL);
    }

    *result = Slice(mmap_base_ + offset, n);
    return Status::OK();
  }